

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPSourceStats::ProcessPacket
          (RTPSourceStats *this,RTPPacket *pack,RTPTime *receivetime,double tsunit,bool ownpacket,
          bool *accept,bool applyprobation,bool *onprobation)

{
  uint16_t uVar1;
  short sVar2;
  uint32_t uVar3;
  uint uVar4;
  bool bVar5;
  double dVar6;
  uint32_t unsigneddiff_1;
  uint32_t unsigneddiff;
  uint32_t curts;
  double diff;
  double diffts2;
  double diffts1;
  RTPTime curtime;
  uint32_t local_48;
  uint16_t dif2;
  uint16_t dif1;
  uint32_t extseqnr;
  uint16_t maxseq16;
  uint32_t pseq2;
  uint16_t pseq;
  bool acceptpack;
  bool applyprobation_local;
  bool *accept_local;
  bool ownpacket_local;
  double tsunit_local;
  RTPTime *receivetime_local;
  RTPPacket *pack_local;
  RTPSourceStats *this_local;
  
  *onprobation = false;
  if ((this->sentdata & 1U) == 0) {
    if (applyprobation) {
      maxseq16._0_1_ = false;
      if (this->probation == 0) {
        this->probation = 2;
        uVar3 = RTPPacket::GetExtendedSequenceNumber(pack);
        this->prevseqnr = (uint16_t)uVar3;
        *onprobation = true;
      }
      else {
        uVar1 = this->prevseqnr;
        uVar3 = RTPPacket::GetExtendedSequenceNumber(pack);
        if ((ushort)(uVar1 + 1) == uVar3) {
          uVar3 = RTPPacket::GetExtendedSequenceNumber(pack);
          this->prevseqnr = (uint16_t)uVar3;
          this->probation = this->probation + -1;
          bVar5 = this->probation != 0;
          if (bVar5) {
            *onprobation = true;
          }
          maxseq16._0_1_ = !bVar5;
        }
        else {
          this->probation = 2;
          uVar3 = RTPPacket::GetExtendedSequenceNumber(pack);
          this->prevseqnr = (uint16_t)uVar3;
          *onprobation = true;
        }
      }
      if (maxseq16._0_1_) {
        *accept = true;
        this->sentdata = true;
        this->packetsreceived = this->packetsreceived + 1;
        this->numnewpackets = this->numnewpackets + 1;
        uVar3 = RTPPacket::GetExtendedSequenceNumber(pack);
        if (uVar3 == 0) {
          this->baseseqnr = 0xffff;
          this->numcycles = 0x10000;
        }
        else {
          uVar3 = RTPPacket::GetExtendedSequenceNumber(pack);
          this->baseseqnr = uVar3 - 1;
        }
        this->exthighseqnr = this->baseseqnr + 1;
        (this->prevpacktime).m_t = receivetime->m_t;
        this->prevexthighseqnr = this->baseseqnr;
        this->savedextseqnr = this->baseseqnr;
        RTPPacket::SetExtendedSequenceNumber(pack,this->exthighseqnr);
        uVar3 = RTPPacket::GetTimestamp(pack);
        this->prevtimestamp = uVar3;
        (this->lastmsgtime).m_t = (this->prevpacktime).m_t;
        if (!ownpacket) {
          (this->lastrtptime).m_t = (this->prevpacktime).m_t;
        }
      }
      else {
        *accept = false;
        (this->lastmsgtime).m_t = receivetime->m_t;
      }
    }
    else {
      *accept = true;
      this->sentdata = true;
      this->packetsreceived = this->packetsreceived + 1;
      this->numnewpackets = this->numnewpackets + 1;
      uVar3 = RTPPacket::GetExtendedSequenceNumber(pack);
      if (uVar3 == 0) {
        this->baseseqnr = 0xffff;
        this->numcycles = 0x10000;
      }
      else {
        uVar3 = RTPPacket::GetExtendedSequenceNumber(pack);
        this->baseseqnr = uVar3 - 1;
      }
      this->exthighseqnr = this->baseseqnr + 1;
      (this->prevpacktime).m_t = receivetime->m_t;
      this->prevexthighseqnr = this->baseseqnr;
      this->savedextseqnr = this->baseseqnr;
      RTPPacket::SetExtendedSequenceNumber(pack,this->exthighseqnr);
      uVar3 = RTPPacket::GetTimestamp(pack);
      this->prevtimestamp = uVar3;
      (this->lastmsgtime).m_t = (this->prevpacktime).m_t;
      if (!ownpacket) {
        (this->lastrtptime).m_t = (this->prevpacktime).m_t;
      }
    }
  }
  else {
    *accept = true;
    this->packetsreceived = this->packetsreceived + 1;
    this->numnewpackets = this->numnewpackets + 1;
    uVar4 = this->exthighseqnr;
    sVar2 = (short)uVar4;
    uVar3 = RTPPacket::GetExtendedSequenceNumber(pack);
    if (uVar3 < (uVar4 & 0xffff)) {
      uVar3 = RTPPacket::GetExtendedSequenceNumber(pack);
      curtime.m_t._6_2_ = (short)uVar3 - sVar2;
      curtime.m_t._4_2_ = sVar2;
      uVar3 = RTPPacket::GetExtendedSequenceNumber(pack);
      curtime.m_t._4_2_ = curtime.m_t._4_2_ - (short)uVar3;
      if (curtime.m_t._6_2_ < curtime.m_t._4_2_) {
        this->numcycles = this->numcycles + 0x10000;
        local_48 = this->numcycles;
        uVar3 = RTPPacket::GetExtendedSequenceNumber(pack);
        local_48 = local_48 + uVar3;
        this->exthighseqnr = local_48;
      }
      else {
        local_48 = this->numcycles;
        uVar3 = RTPPacket::GetExtendedSequenceNumber(pack);
        local_48 = local_48 + uVar3;
      }
    }
    else {
      local_48 = this->numcycles;
      uVar3 = RTPPacket::GetExtendedSequenceNumber(pack);
      local_48 = local_48 + uVar3;
      this->exthighseqnr = local_48;
    }
    RTPPacket::SetExtendedSequenceNumber(pack,local_48);
    if (tsunit <= 0.0) {
      this->djitter = 0.0;
      this->jitter = 0;
    }
    else {
      diffts1 = receivetime->m_t;
      uVar3 = RTPPacket::GetTimestamp(pack);
      RTPTime::operator-=((RTPTime *)&diffts1,&this->prevpacktime);
      dVar6 = RTPTime::GetDouble((RTPTime *)&diffts1);
      if (this->prevtimestamp < uVar3) {
        uVar4 = uVar3 - this->prevtimestamp;
        if (uVar4 < 0x10000000) {
          diff = (double)uVar4;
        }
        else {
          diff = -(double)-uVar4;
        }
      }
      else if (uVar3 < this->prevtimestamp) {
        uVar4 = this->prevtimestamp - uVar3;
        if (uVar4 < 0x10000000) {
          diff = -(double)uVar4;
        }
        else {
          diff = (double)-uVar4;
        }
      }
      else {
        diff = 0.0;
      }
      _unsigneddiff = dVar6 / tsunit - diff;
      if (_unsigneddiff < 0.0) {
        _unsigneddiff = -_unsigneddiff;
      }
      this->djitter = this->djitter + (_unsigneddiff - this->djitter) * 0.0625;
      this->jitter = (uint32_t)(long)this->djitter;
    }
    (this->prevpacktime).m_t = receivetime->m_t;
    uVar3 = RTPPacket::GetTimestamp(pack);
    this->prevtimestamp = uVar3;
    (this->lastmsgtime).m_t = (this->prevpacktime).m_t;
    if (!ownpacket) {
      (this->lastrtptime).m_t = (this->prevpacktime).m_t;
    }
  }
  return;
}

Assistant:

void RTPSourceStats::ProcessPacket(RTPPacket *pack,const RTPTime &receivetime,double tsunit,
                                   bool ownpacket,bool *accept,bool applyprobation,bool *onprobation)
{
	JRTPLIB_UNUSED(applyprobation); // possibly unused

	// Note that the sequence number in the RTP packet is still just the
	// 16 bit number contained in the RTP header

	*onprobation = false;
	
	if (!sentdata) // no valid packets received yet
	{
#ifdef RTP_SUPPORT_PROBATION
		if (applyprobation)
		{
			bool acceptpack = false;

			if (probation)  
			{	
				uint16_t pseq;
				uint32_t pseq2;
	
				pseq = prevseqnr;
				pseq++;
				pseq2 = (uint32_t)pseq;
				if (pseq2 == pack->GetExtendedSequenceNumber()) // ok, its the next expected packet
				{
					prevseqnr = (uint16_t)pack->GetExtendedSequenceNumber();
					probation--;	
					if (probation == 0) // probation over
						acceptpack = true;
					else
						*onprobation = true;
				}
				else // not next packet
				{
					probation = RTP_PROBATIONCOUNT;
					prevseqnr = (uint16_t)pack->GetExtendedSequenceNumber();
					*onprobation = true;
				}
			}
			else // first packet received with this SSRC ID, start probation
			{
				probation = RTP_PROBATIONCOUNT;
				prevseqnr = (uint16_t)pack->GetExtendedSequenceNumber();	
				*onprobation = true;
			}
	
			if (acceptpack)
			{
				ACCEPTPACKETCODE
			}
			else
			{
				*accept = false;
				lastmsgtime = receivetime;
			}
		}
		else // No probation
		{
			ACCEPTPACKETCODE
		}
#else // No compiled-in probation support

		ACCEPTPACKETCODE

#endif // RTP_SUPPORT_PROBATION
	}
	else // already got packets
	{
		uint16_t maxseq16;
		uint32_t extseqnr;

		// Adjust max extended sequence number and set extende seq nr of packet

		*accept = true;
		packetsreceived++;
		numnewpackets++;

		maxseq16 = (uint16_t)(exthighseqnr&0x0000FFFF);
		if (pack->GetExtendedSequenceNumber() >= maxseq16)
		{
			extseqnr = numcycles+pack->GetExtendedSequenceNumber();
			exthighseqnr = extseqnr;
		}
		else
		{
			uint16_t dif1,dif2;

			dif1 = ((uint16_t)pack->GetExtendedSequenceNumber());
			dif1 -= maxseq16;
			dif2 = maxseq16;
			dif2 -= ((uint16_t)pack->GetExtendedSequenceNumber());
			if (dif1 < dif2)
			{
				numcycles += 0x00010000;
				extseqnr = numcycles+pack->GetExtendedSequenceNumber();
				exthighseqnr = extseqnr;
			}
			else
				extseqnr = numcycles+pack->GetExtendedSequenceNumber();
		}

		pack->SetExtendedSequenceNumber(extseqnr);

		// Calculate jitter

		if (tsunit > 0)
		{
#if 0
			RTPTime curtime = receivetime;
			double diffts1,diffts2,diff;

			curtime -= prevpacktime;
			diffts1 = curtime.GetDouble()/tsunit;	
			diffts2 = (double)pack->GetTimestamp() - (double)prevtimestamp;
			diff = diffts1 - diffts2;
			if (diff < 0)
				diff = -diff;
			diff -= djitter;
			diff /= 16.0;
			djitter += diff;
			jitter = (uint32_t)djitter;
#else
RTPTime curtime = receivetime;
double diffts1,diffts2,diff;
uint32_t curts = pack->GetTimestamp();

curtime -= prevpacktime;
diffts1 = curtime.GetDouble()/tsunit;	

if (curts > prevtimestamp)
{
	uint32_t unsigneddiff = curts - prevtimestamp;

	if (unsigneddiff < 0x10000000) // okay, curts realy is larger than prevtimestamp
		diffts2 = (double)unsigneddiff;
	else
	{
		// wraparound occurred and curts is actually smaller than prevtimestamp

		unsigneddiff = -unsigneddiff; // to get the actual difference (in absolute value)
		diffts2 = -((double)unsigneddiff);
	}
}
else if (curts < prevtimestamp)
{
	uint32_t unsigneddiff = prevtimestamp - curts;

	if (unsigneddiff < 0x10000000) // okay, curts really is smaller than prevtimestamp
		diffts2 = -((double)unsigneddiff); // negative since we actually need curts-prevtimestamp
	else
	{
		// wraparound occurred and curts is actually larger than prevtimestamp

		unsigneddiff = -unsigneddiff; // to get the actual difference (in absolute value)
		diffts2 = (double)unsigneddiff;
	}
}
else
	diffts2 = 0;

diff = diffts1 - diffts2;
if (diff < 0)
	diff = -diff;
diff -= djitter;
diff /= 16.0;
djitter += diff;
jitter = (uint32_t)djitter;
#endif
		}
		else
		{
			djitter = 0;
			jitter = 0;
		}

		prevpacktime = receivetime;
		prevtimestamp = pack->GetTimestamp();
		lastmsgtime = prevpacktime;
		if (!ownpacket) // for own packet, this value is set on an outgoing packet
			lastrtptime = prevpacktime;
	}
}